

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O3

Vec_Ptr_t * Llb_ManCutRange(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper)

{
  void *pvVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  
  Aig_ManIncrementTravId(p);
  iVar5 = vLower->nSize;
  if (0 < (long)iVar5) {
    ppvVar3 = vLower->pArray;
    iVar8 = p->nTravIds;
    lVar7 = 0;
    do {
      *(int *)((long)ppvVar3[lVar7] + 0x20) = iVar8;
      lVar7 = lVar7 + 1;
    } while (iVar5 != lVar7);
  }
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  iVar5 = vUpper->nSize;
  if (0 < iVar5) {
    iVar8 = 0;
    uVar6 = 100;
    lVar7 = 0;
    do {
      pvVar1 = vUpper->pArray[lVar7];
      if (*(int *)((long)pvVar1 + 0x20) != p->nTravIds) {
        iVar5 = (int)uVar6;
        if (iVar8 == iVar5) {
          if (iVar5 < 0x10) {
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(0x80);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
            }
            pVVar2->pArray = ppvVar3;
            pVVar2->nCap = 0x10;
            uVar6 = 0x10;
          }
          else {
            uVar6 = (ulong)(uint)(iVar5 * 2);
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(uVar6 * 8);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar2->pArray,uVar6 * 8);
            }
            pVVar2->pArray = ppvVar3;
            pVVar2->nCap = iVar5 * 2;
          }
        }
        else {
          ppvVar3 = pVVar2->pArray;
        }
        lVar4 = (long)iVar8;
        iVar8 = iVar8 + 1;
        pVVar2->nSize = iVar8;
        ppvVar3[lVar4] = pvVar1;
        iVar5 = vUpper->nSize;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar5);
  }
  return pVVar2;
}

Assistant:

Vec_Ptr_t * Llb_ManCutRange( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper )
{
    Vec_Ptr_t * vRange;
    Aig_Obj_t * pObj;
    int i;
    // mark the lower cut with the traversal ID
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );
    // collect the upper ones that are not marked
    vRange = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vUpper, pObj, i )
        if ( !Aig_ObjIsTravIdCurrent(p, pObj) )
            Vec_PtrPush( vRange, pObj );
    return vRange;
}